

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::TraceSettings(GlobOpt *this)

{
  bool bVar1;
  ImplicitCallFlags flags;
  uint uVar2;
  char16 *pcVar3;
  char16_t *pcVar4;
  Loop *local_18;
  Loop *loop;
  GlobOpt *this_local;
  
  Output::Print(L"GlobOpt Settings:\r\n");
  bVar1 = DoFloatTypeSpec(this);
  pcVar4 = L"disabled";
  if (bVar1) {
    pcVar4 = L"enabled";
  }
  Output::Print(L"    FloatTypeSpec: %s\r\n",pcVar4);
  bVar1 = DoAggressiveIntTypeSpec(this);
  pcVar4 = L"disabled";
  if (bVar1) {
    pcVar4 = L"enabled";
  }
  Output::Print(L"    AggressiveIntTypeSpec: %s\r\n",pcVar4);
  bVar1 = DoLossyIntTypeSpec(this);
  pcVar4 = L"disabled";
  if (bVar1) {
    pcVar4 = L"enabled";
  }
  Output::Print(L"    LossyIntTypeSpec: %s\r\n",pcVar4);
  bVar1 = Func::IsArrayCheckHoistDisabled(this->func);
  pcVar4 = L"enabled";
  if (bVar1) {
    pcVar4 = L"disabled";
  }
  Output::Print(L"    ArrayCheckHoist: %s\r\n",pcVar4);
  pcVar3 = Js::DynamicProfileInfo::GetImplicitCallFlagsString(this->func->m_fg->implicitCallFlags);
  Output::Print(L"    ImplicitCallFlags: %s\r\n",pcVar3);
  for (local_18 = this->func->m_fg->loopList; local_18 != (Loop *)0x0; local_18 = local_18->next) {
    uVar2 = Loop::GetLoopNumber(local_18);
    flags = Loop::GetImplicitCallFlags(local_18);
    pcVar3 = Js::DynamicProfileInfo::GetImplicitCallFlagsString(flags);
    Output::Print(L"        loop: %d, ImplicitCallFlags: %s\r\n",(ulong)uVar2,pcVar3);
  }
  Output::Flush();
  return;
}

Assistant:

void
GlobOpt::TraceSettings() const
{
    Output::Print(_u("GlobOpt Settings:\r\n"));
    Output::Print(_u("    FloatTypeSpec: %s\r\n"), this->DoFloatTypeSpec() ? _u("enabled") : _u("disabled"));
    Output::Print(_u("    AggressiveIntTypeSpec: %s\r\n"), this->DoAggressiveIntTypeSpec() ? _u("enabled") : _u("disabled"));
    Output::Print(_u("    LossyIntTypeSpec: %s\r\n"), this->DoLossyIntTypeSpec() ? _u("enabled") : _u("disabled"));
    Output::Print(_u("    ArrayCheckHoist: %s\r\n"),  this->func->IsArrayCheckHoistDisabled() ? _u("disabled") : _u("enabled"));
    Output::Print(_u("    ImplicitCallFlags: %s\r\n"), Js::DynamicProfileInfo::GetImplicitCallFlagsString(this->func->m_fg->implicitCallFlags));
    for (Loop * loop = this->func->m_fg->loopList; loop != NULL; loop = loop->next)
    {
        Output::Print(_u("        loop: %d, ImplicitCallFlags: %s\r\n"), loop->GetLoopNumber(),
            Js::DynamicProfileInfo::GetImplicitCallFlagsString(loop->GetImplicitCallFlags()));
    }

    Output::Flush();
}